

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O2

void __thiscall BeliefSetNonStationary::~BeliefSetNonStationary(BeliefSetNonStationary *this)

{
  long lVar1;
  long *plVar2;
  pointer pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar3 = (this->_m_beliefSets).
           super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      ((long)(this->_m_beliefSets).
             super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18 != uVar6;
      uVar5 = uVar5 + 1) {
    uVar4 = 0;
    while( true ) {
      lVar1 = *(long *)&pvVar3[uVar6].
                        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                        ._M_impl;
      if ((long)*(pointer *)
                 ((long)&pvVar3[uVar6].
                         super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                         ._M_impl + 8) - lVar1 >> 3 == (ulong)uVar4) break;
      plVar2 = *(long **)(lVar1 + (ulong)uVar4 * 8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
        pvVar3 = (this->_m_beliefSets).
                 super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar4 = uVar4 + 1;
    }
  }
  std::
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  ::~vector(&this->_m_beliefSets);
  return;
}

Assistant:

BeliefSetNonStationary::~BeliefSetNonStationary()
{
    for(Index t=0;t!=_m_beliefSets.size();++t)
        for(Index j=0;j!=_m_beliefSets[t].size();j++)
            delete _m_beliefSets[t][j];
}